

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_DCtx_refDDict(ZSTD_DCtx *dctx,ZSTD_DDict *ddict)

{
  ZSTD_allocFunction p_Var1;
  ZSTD_freeFunction p_Var2;
  void *pvVar3;
  ZSTD_DDict **__ptr;
  ZSTD_DDictHashSet *pZVar4;
  ZSTD_DDict **ppZVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  size_t __size;
  
  if (dctx->streamStage != zdss_init) {
    return 0xffffffffffffffc4;
  }
  ZSTD_freeDDict(dctx->ddictLocal);
  dctx->dictUses = ZSTD_dont_use;
  dctx->ddictLocal = (ZSTD_DDict *)0x0;
  dctx->ddict = (ZSTD_DDict *)0x0;
  if (ddict == (ZSTD_DDict *)0x0) {
    return 0;
  }
  dctx->ddict = ddict;
  dctx->dictUses = ZSTD_use_indefinitely;
  if (dctx->refMultipleDDicts != ZSTD_rmd_refMultipleDDicts) {
    return 0;
  }
  if (dctx->ddictSet == (ZSTD_DDictHashSet *)0x0) {
    p_Var1 = (dctx->customMem).customAlloc;
    p_Var2 = (dctx->customMem).customFree;
    pvVar3 = (dctx->customMem).opaque;
    if (p_Var1 == (ZSTD_allocFunction)0x0) {
      pZVar4 = (ZSTD_DDictHashSet *)malloc(0x18);
    }
    else {
      pZVar4 = (ZSTD_DDictHashSet *)(*p_Var1)(pvVar3,0x18);
    }
    if (pZVar4 == (ZSTD_DDictHashSet *)0x0) {
LAB_00216408:
      pZVar4 = (ZSTD_DDictHashSet *)0x0;
    }
    else {
      if (p_Var1 == (ZSTD_allocFunction)0x0) {
        ppZVar5 = (ZSTD_DDict **)calloc(1,0x200);
      }
      else {
        ppZVar5 = (ZSTD_DDict **)(*p_Var1)(pvVar3,0x200);
        memset(ppZVar5,0,0x200);
      }
      pZVar4->ddictPtrTable = ppZVar5;
      if (ppZVar5 == (ZSTD_DDict **)0x0) {
        if (p_Var2 == (ZSTD_freeFunction)0x0) {
          free(pZVar4);
        }
        else {
          (*p_Var2)(pvVar3,pZVar4);
        }
        goto LAB_00216408;
      }
      pZVar4->ddictPtrTableSize = 0x40;
      pZVar4->ddictPtrCount = 0;
    }
    dctx->ddictSet = pZVar4;
    if (pZVar4 == (ZSTD_DDictHashSet *)0x0) {
      return 0xffffffffffffffc0;
    }
  }
  if (dctx->staticSize != 0) {
    __assert_fail("!dctx->staticSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                  ,0x6e6,"size_t ZSTD_DCtx_refDDict(ZSTD_DCtx *, const ZSTD_DDict *)");
  }
  pZVar4 = dctx->ddictSet;
  uVar6 = pZVar4->ddictPtrTableSize;
  if (uVar6 <= pZVar4->ddictPtrCount << 2) {
    p_Var1 = (dctx->customMem).customAlloc;
    p_Var2 = (dctx->customMem).customFree;
    pvVar3 = (dctx->customMem).opaque;
    __size = uVar6 << 4;
    if (p_Var1 == (ZSTD_allocFunction)0x0) {
      ppZVar5 = (ZSTD_DDict **)calloc(1,__size);
    }
    else {
      ppZVar5 = (ZSTD_DDict **)(*p_Var1)(pvVar3,__size);
      memset(ppZVar5,0,__size);
    }
    if (ppZVar5 == (ZSTD_DDict **)0x0) {
      uVar6 = 0xffffffffffffffc0;
    }
    else {
      __ptr = pZVar4->ddictPtrTable;
      sVar7 = pZVar4->ddictPtrTableSize;
      pZVar4->ddictPtrTable = ppZVar5;
      pZVar4->ddictPtrTableSize = uVar6 * 2;
      pZVar4->ddictPtrCount = 0;
      if (sVar7 != 0) {
        sVar8 = 0;
        do {
          if ((__ptr[sVar8] != (ZSTD_DDict *)0x0) &&
             (uVar6 = ZSTD_DDictHashSet_emplaceDDict(pZVar4,__ptr[sVar8]),
             0xffffffffffffff88 < uVar6)) goto LAB_0021651b;
          sVar8 = sVar8 + 1;
        } while (sVar7 != sVar8);
      }
      if (__ptr != (ZSTD_DDict **)0x0) {
        if (p_Var2 == (ZSTD_freeFunction)0x0) {
          free(__ptr);
        }
        else {
          (*p_Var2)(pvVar3,__ptr);
        }
      }
      uVar6 = 0;
    }
LAB_0021651b:
    if (0xffffffffffffff88 < uVar6) goto LAB_00216537;
  }
  sVar7 = ZSTD_DDictHashSet_emplaceDDict(pZVar4,ddict);
  uVar6 = 0;
  if (0xffffffffffffff88 < sVar7) {
    uVar6 = sVar7;
  }
LAB_00216537:
  if (uVar6 < 0xffffffffffffff89) {
    return 0;
  }
  return uVar6;
}

Assistant:

size_t ZSTD_DCtx_refDDict(ZSTD_DCtx* dctx, const ZSTD_DDict* ddict)
{
    RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong, "");
    ZSTD_clearDict(dctx);
    if (ddict) {
        dctx->ddict = ddict;
        dctx->dictUses = ZSTD_use_indefinitely;
        if (dctx->refMultipleDDicts == ZSTD_rmd_refMultipleDDicts) {
            if (dctx->ddictSet == NULL) {
                dctx->ddictSet = ZSTD_createDDictHashSet(dctx->customMem);
                if (!dctx->ddictSet) {
                    RETURN_ERROR(memory_allocation, "Failed to allocate memory for hash set!");
                }
            }
            assert(!dctx->staticSize);  /* Impossible: ddictSet cannot have been allocated if static dctx */
            FORWARD_IF_ERROR(ZSTD_DDictHashSet_addDDict(dctx->ddictSet, ddict, dctx->customMem), "");
        }
    }
    return 0;
}